

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Var * __thiscall wabt::Var::operator=(Var *this,Var *rhs)

{
  bool bVar1;
  string_view local_28;
  Var *local_18;
  Var *rhs_local;
  Var *this_local;
  
  (this->loc).filename.data_ = (rhs->loc).filename.data_;
  (this->loc).filename.size_ = (rhs->loc).filename.size_;
  (this->loc).field_1.field_1.offset = (rhs->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&(rhs->loc).field_1 + 8);
  local_18 = rhs;
  rhs_local = this;
  bVar1 = is_index(rhs);
  if (bVar1) {
    set_index(this,(local_18->field_2).index_);
  }
  else {
    string_view::string_view(&local_28,&(local_18->field_2).name_);
    set_name(this,local_28);
  }
  return this;
}

Assistant:

Var& Var::operator=(const Var& rhs) {
  loc = rhs.loc;
  if (rhs.is_index()) {
    set_index(rhs.index_);
  } else {
    set_name(rhs.name_);
  }
  return *this;
}